

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

GeomPoints * __thiscall tinyusdz::Prim::as<tinyusdz::GeomPoints>(Prim *this)

{
  GeomPoints *pGVar1;
  
  pGVar1 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(&this->_data,false);
  return pGVar1;
}

Assistant:

const T *as() const {
    // Check if T is Prim type. e.g. Xform, Material, ...
    if ((value::TypeId::TYPE_ID_MODEL_BEGIN <=
         value::TypeTraits<T>::type_id()) &&
        (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id())) {
      return _data.as<T>();
    }

    return nullptr;
  }